

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O2

int unlzw(FILE *in,FILE *out)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  voidp pvVar10;
  ulong uVar11;
  ush *__src;
  char *m;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar18;
  ulong uStack_a0;
  ulong local_90;
  voidp local_88;
  ulong uVar17;
  
  uVar4 = (ulong)inptr;
  ofd = out;
  if (inptr < insize) {
    inptr = inptr + 1;
    maxbits = (int)inbuf[uVar4];
  }
  else {
    maxbits = fill_inbuf((int)in);
  }
  block_mode = maxbits & 0x80;
  if ((maxbits & 0x60U) != 0) {
    error("warning, unknown flags in unlzw decompression");
  }
  iVar2 = block_mode;
  maxbits = maxbits & 0x1f;
  uVar4 = 1L << (sbyte)maxbits;
  if (0x10 < (uint)maxbits) {
    m = "compressed with too many bits; cannot handle file";
LAB_001c402c:
    error(m);
    return 1;
  }
  sVar6 = (size_t)insize;
  uVar9 = inptr << 3;
  memset(prev,0,0x100);
  for (lVar5 = 0xff; -1 < lVar5; lVar5 = lVar5 + -1) {
    window[lVar5] = (uch)lVar5;
  }
  uVar11 = (ulong)uVar9;
  lVar5 = 0x101 - (ulong)(iVar2 == 0);
  uStack_a0 = 9;
  uVar18 = 0x1ff;
  uVar9 = 0x1ff;
  local_88 = (voidp)0x0;
  local_90 = 0;
  uVar8 = 0xffffffffffffffff;
LAB_001c3c1c:
  iVar2 = (int)uStack_a0;
  uVar12 = uVar8;
LAB_001c3c3e:
  iVar3 = (int)(uVar11 >> 3);
  insize = insize - iVar3;
  uVar8 = 0;
  if (0 < (int)insize) {
    uVar8 = (ulong)insize;
  }
  for (uVar11 = 0; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    inbuf[uVar11] = inbuf[(long)iVar3 + uVar11];
  }
  if (insize < 0x40) {
    sVar6 = fread(inbuf + insize,1,0x8000,(FILE *)in);
    iVar3 = (int)sVar6;
    if (iVar3 == -1) {
      m = "unexpected end of file";
      goto LAB_001c402c;
    }
    insize = insize + iVar3;
    bytes_in = bytes_in + iVar3;
  }
  uVar8 = (ulong)insize;
  if ((int)sVar6 == 0) {
    lVar13 = uVar8 * 8 - (long)(iVar2 + -1);
  }
  else {
    lVar13 = (uVar8 - uVar8 % uStack_a0) * 8;
  }
  uVar14 = 0;
  uVar8 = uVar12;
  do {
    pvVar10 = (voidp)(long)(int)local_88;
    iVar3 = (int)local_88 + 0x3af0ff;
    uVar12 = uVar8;
    uVar11 = uVar14;
    uVar15 = local_90;
    while( true ) {
      if (lVar13 <= (long)uVar11) {
        local_88 = (voidp)((ulong)pvVar10 & 0xffffffff);
        local_90 = uVar15;
        if ((int)sVar6 == 0) {
          if ((long)pvVar10 < 1) {
            return 0;
          }
          write_buf((voidp)((ulong)pvVar10 & 0xffffffff),(uint)uVar8);
          bytes_out = bytes_out + ((ulong)pvVar10 & 0xffffffff);
          return 0;
        }
        goto LAB_001c3c3e;
      }
      if ((long)uVar18 < lVar5) {
        lVar13 = uVar14 + (long)(iVar2 * 8) + -1;
        uVar9 = iVar2 + 1;
        uStack_a0 = (ulong)uVar9;
        uVar11 = lVar13 - lVar13 % (long)(iVar2 * 8);
        uVar18 = ~(-1L << ((byte)uVar9 & 0x3f));
        if (uVar9 == maxbits) {
          uVar18 = uVar4;
        }
        uVar9 = ~(-1 << ((byte)uVar9 & 0x1f));
        goto LAB_001c3c1c;
      }
      uVar16 = *(uint3 *)(inbuf + ((long)uVar11 >> 3)) >> ((byte)uVar11 & 7) & uVar9;
      uVar17 = (ulong)uVar16;
      uVar11 = uVar11 + (long)iVar2;
      if (uVar12 != 0xffffffffffffffff) break;
      if (0xff < uVar16) goto LAB_001c4025;
      *(char *)((long)pvVar10 + 0x39a900) = (char)uVar16;
      pvVar10 = (voidp)((long)pvVar10 + 1);
      iVar3 = iVar3 + 1;
      uVar12 = uVar17;
      uVar15 = uVar17;
    }
    if ((uVar16 == 0x100) && (block_mode != 0)) {
      memset(prev,0,0x100);
      lVar5 = 0x100;
      lVar13 = uVar11 + (long)(iVar2 << 3) + -1;
      uVar11 = lVar13 - lVar13 % (long)(iVar2 << 3);
      uVar9 = 0x1ff;
      uVar18 = 0x1ff;
      uStack_a0 = 9;
      uVar8 = uVar12;
      local_90 = uVar15;
      local_88 = pvVar10;
      goto LAB_001c3c1c;
    }
    __src = d_buf + 0x7fff;
    uVar8 = uVar17;
    if (lVar5 <= (long)uVar17) {
      if (lVar5 < (long)uVar17) {
        if (0 < (long)pvVar10) {
          write_buf((voidp)((ulong)pvVar10 & 0xffffffff),0x3af0fe);
          bytes_out = bytes_out + ((ulong)pvVar10 & 0xffffffff);
        }
LAB_001c4025:
        m = "corrupt input.";
        goto LAB_001c402c;
      }
      d_buf[0x7ffe]._1_1_ = (undefined1)uVar15;
      __src = (ush *)((long)d_buf + 0xfffd);
      uVar8 = uVar12;
    }
    uVar7 = 0x3af0ff - (int)__src;
    uVar16 = iVar3 - (int)__src;
    while( true ) {
      __src = (ush *)((long)__src + -1);
      local_88 = (voidp)(ulong)uVar16;
      bVar1 = window[uVar8];
      local_90 = (ulong)bVar1;
      *(byte *)__src = bVar1;
      if (uVar8 < 0x100) break;
      uVar8 = (ulong)prev[uVar8];
      uVar7 = uVar7 + 1;
      uVar16 = uVar16 + 1;
    }
    if ((int)uVar16 < 0x4000) {
      memcpy(outbuf + (int)pvVar10,__src,(long)(int)uVar7);
    }
    else {
      local_88 = (voidp)((ulong)pvVar10 & 0xffffffff);
      do {
        iVar3 = (int)local_88;
        uVar16 = 0x4000U - iVar3;
        if ((int)uVar7 < (int)(0x4000U - iVar3)) {
          uVar16 = uVar7;
        }
        if (0 < (int)uVar16) {
          memcpy(outbuf + iVar3,__src,(ulong)uVar16);
          local_88 = (voidp)(ulong)(iVar3 + uVar16);
        }
        if (0x3fff < (int)(uint)local_88) {
          write_buf(local_88,(uint)local_88);
          bytes_out = bytes_out + (long)local_88;
          local_88 = (voidp)0x0;
        }
        __src = (ush *)((long)__src + (long)(int)uVar16);
        uVar7 = 0x3af0fe - (int)__src;
      } while (0 < (int)uVar7);
    }
    uVar14 = uVar11;
    uVar8 = uVar17;
    if (lVar5 < (long)uVar4) {
      prev[lVar5] = (ush)uVar12;
      window[lVar5] = bVar1;
      lVar5 = lVar5 + 1;
    }
  } while( true );
}

Assistant:

local int unlzw(FILE *in, FILE *out) 
    /* input and output file descriptors */
{
    REG2   char_type  *stackp;
    REG3   code_int   code;
    REG4   int        finchar;
    REG5   code_int   oldcode;
    REG6   code_int   incode;
    REG7   long       inbits;
    REG8   long       posbits;
    REG9   int        outpos;
/*  REG10  int        insize; (global) */
    REG11  unsigned   bitmask;
    REG12  code_int   free_ent;
    REG13  code_int   maxcode;
    REG14  code_int   maxmaxcode;
    REG15  int        n_bits;
    REG16  int        rsize;
    
    ofd = out;

#ifdef MAXSEG_64K
    tab_prefix[0] = tab_prefix0;
    tab_prefix[1] = tab_prefix1;
#endif
    maxbits = get_byte();
    block_mode = maxbits & BLOCK_MODE;
    if ((maxbits & LZW_RESERVED) != 0) {
	error( "warning, unknown flags in unlzw decompression");
    }
    maxbits &= BIT_MASK;
    maxmaxcode = MAXCODE(maxbits);
    
    if (maxbits > BITS) {
	error("compressed with too many bits; cannot handle file");
	exit_code = ERROR;
	return ERROR;
    }
    rsize = insize;
    maxcode = MAXCODE(n_bits = INIT_BITS)-1;
    bitmask = (1<<n_bits)-1;
    oldcode = -1;
    finchar = 0;
    outpos = 0;
    posbits = inptr<<3;

    free_ent = ((block_mode) ? FIRST : 256);
    
    clear_tab_prefixof(); /* Initialize the first 256 entries in the table. */
    
    for (code = 255 ; code >= 0 ; --code) {
	tab_suffixof(code) = (char_type)code;
    }
    do {
	REG1 int i;
	int  e;
	int  o;
	
    resetbuf:
	e = insize-(o = (posbits>>3));
	
	for (i = 0 ; i < e ; ++i) {
	    inbuf[i] = inbuf[i+o];
	}
	insize = e;
	posbits = 0;
	
	if (insize < INBUF_EXTRA) {
/*  modified to use fread instead of read - WDP 10/22/97  */
/*	    if ((rsize = read(in, (char*)inbuf+insize, INBUFSIZ)) == EOF) { */

	    if ((rsize = fread((char*)inbuf+insize, 1, INBUFSIZ, in)) == EOF) {
		error("unexpected end of file");
	        exit_code = ERROR;
                return ERROR;
	    }
	    insize += rsize;
	    bytes_in += (ulg)rsize;
	}
	inbits = ((rsize != 0) ? ((long)insize - insize%n_bits)<<3 : 
		  ((long)insize<<3)-(n_bits-1));
	
	while (inbits > posbits) {
	    if (free_ent > maxcode) {
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		++n_bits;
		if (n_bits == maxbits) {
		    maxcode = maxmaxcode;
		} else {
		    maxcode = MAXCODE(n_bits)-1;
		}
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    input(inbuf,posbits,code,n_bits,bitmask);
	    Tracev((stderr, "%d ", code));

	    if (oldcode == -1) {
		if (code >= 256) {
                    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;
                }

		outbuf[outpos++] = (char_type)(finchar = (int)(oldcode=code));
		continue;
	    }
	    if (code == CLEAR && block_mode) {
		clear_tab_prefixof();
		free_ent = FIRST - 1;
		posbits = ((posbits-1) +
			   ((n_bits<<3)-(posbits-1+(n_bits<<3))%(n_bits<<3)));
		maxcode = MAXCODE(n_bits = INIT_BITS)-1;
		bitmask = (1<<n_bits)-1;
		goto resetbuf;
	    }
	    incode = code;
	    stackp = de_stack;
	    
	    if (code >= free_ent) { /* Special case for KwKwK string. */
		if (code > free_ent) {
		    if (outpos > 0) {
			write_buf((char*)outbuf, outpos);
			bytes_out += (ulg)outpos;
		    }
		    error("corrupt input.");
	            exit_code = ERROR;
                    return ERROR;

		}
		*--stackp = (char_type)finchar;
		code = oldcode;
	    }

	    while ((cmp_code_int)code >= (cmp_code_int)256) {
		/* Generate output characters in reverse order */
		*--stackp = tab_suffixof(code);
		code = tab_prefixof(code);
	    }
	    *--stackp =	(char_type)(finchar = tab_suffixof(code));
	    
	    /* And put them out in forward order */
	    {
	/*	REG1 int	i;   already defined above (WDP) */
	    
		if (outpos+(i = (de_stack-stackp)) >= OUTBUFSIZ) {
		    do {
			if (i > OUTBUFSIZ-outpos) i = OUTBUFSIZ-outpos;

			if (i > 0) {
			    memcpy(outbuf+outpos, stackp, i);
			    outpos += i;
			}
			if (outpos >= OUTBUFSIZ) {
			    write_buf((char*)outbuf, outpos);
			    bytes_out += (ulg)outpos;
			    outpos = 0;
			}
			stackp+= i;
		    } while ((i = (de_stack-stackp)) > 0);
		} else {
		    memcpy(outbuf+outpos, stackp, i);
		    outpos += i;
		}
	    }

	    if ((code = free_ent) < maxmaxcode) { /* Generate the new entry. */

		tab_prefixof(code) = (unsigned short)oldcode;
		tab_suffixof(code) = (char_type)finchar;
		free_ent = code+1;
	    } 
	    oldcode = incode;	/* Remember previous code.	*/
	}
    } while (rsize != 0);
    
    if (outpos > 0) {
	write_buf((char*)outbuf, outpos);
	bytes_out += (ulg)outpos;
    }
    return OK;
}